

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start_Resume_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Start_Resume_PDU::Encode(Start_Resume_PDU *this,KDataStream *stream)

{
  Simulation_Management_Header::Encode(&this->super_Simulation_Management_Header,stream);
  (*(this->m_RealWorldTime).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_RealWorldTime,stream)
  ;
  (*(this->m_SimTime).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_SimTime,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32RequestID);
  return;
}

Assistant:

void Start_Resume_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );
    stream << KDIS_STREAM m_RealWorldTime
           << KDIS_STREAM m_SimTime
           << m_ui32RequestID;
}